

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O2

NodeRef<typename_KeyConverter::Key> __thiscall
miniscript::FromScript<(anonymous_namespace)::KeyConverter>
          (miniscript *this,CScript *script,KeyConverter *ctx)

{
  pointer ptVar1;
  __shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2> *__r;
  long lVar2;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var3;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var4;
  pointer puVar5;
  pointer puVar6;
  Node<CPubKey> *this_00;
  uint uVar7;
  pointer ppVar8;
  pointer psVar9;
  undefined8 uVar10;
  pointer pCVar11;
  bool bVar12;
  uint32_t uVar13;
  uint uVar14;
  opcodetype oVar15;
  mapped_type *__src;
  _Storage<long,_true> _Var16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var17;
  int i;
  long lVar18;
  Fragment nt;
  pointer ppVar19;
  long lVar20;
  pointer *ppuVar21;
  element_type *peVar22;
  long in_FS_OFFSET;
  optional<long> oVar23;
  NodeRef<typename_KeyConverter::Key> NVar24;
  int iStack_1b0;
  pointer local_1a0;
  _Storage<long,_true> local_190;
  NodeRef<CPubKey> ret;
  undefined1 local_168 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_158;
  undefined1 local_14c [4];
  vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
  constructed;
  vector<std::tuple<miniscript::internal::DecodeContext,_long,_long>,_std::allocator<std::tuple<miniscript::internal::DecodeContext,_long,_long>_>_>
  to_parse;
  optional<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  decomposed;
  optional<long> k_1;
  _Storage<long,_true> local_d8;
  undefined1 auStack_d0 [5];
  undefined3 uStack_cb;
  _Head_base<2UL,_long,_false> local_c8;
  ulong uStack_c0;
  ulong local_b8;
  vector<CPubKey,_std::allocator<CPubKey>_> keys;
  optional<CPubKey> key;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar14 = (script->super_CScriptBase)._size;
  uVar7 = uVar14 - 0x1d;
  if (uVar14 < 0x1d) {
    uVar7 = uVar14;
  }
  uVar13 = internal::MaxScriptSize(ctx->m_script_ctx);
  if (uVar13 < uVar7) {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) goto LAB_003b6d0b;
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    _Var17._M_pi = extraout_RDX;
    goto LAB_003b68e7;
  }
  internal::DecomposeScript(&decomposed,script);
  uVar10 = decomposed.
           super__Optional_base<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
           ._M_payload._M_value.
           super__Vector_base<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (decomposed.
      super__Optional_base<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
      ._M_engaged != false) {
    local_1a0 = decomposed.
                super__Optional_base<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                ._M_payload._M_value.
                super__Vector_base<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    to_parse.
    super__Vector_base<std::tuple<miniscript::internal::DecodeContext,_long,_long>,_std::allocator<std::tuple<miniscript::internal::DecodeContext,_long,_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    constructed.
    super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    to_parse.
    super__Vector_base<std::tuple<miniscript::internal::DecodeContext,_long,_long>,_std::allocator<std::tuple<miniscript::internal::DecodeContext,_long,_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    to_parse.
    super__Vector_base<std::tuple<miniscript::internal::DecodeContext,_long,_long>,_std::allocator<std::tuple<miniscript::internal::DecodeContext,_long,_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    constructed.
    super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    constructed.
    super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    key.super__Optional_base<CPubKey,_true,_true>._M_payload.super__Optional_payload_base<CPubKey>.
    _M_payload._0_4_ = 1;
    local_c8._M_head_impl._0_4_ = 0xffffffff;
    keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,0xffffffff);
    std::
    vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
    ::emplace_back<miniscript::internal::DecodeContext,int,int>
              ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                *)&to_parse,(DecodeContext *)&key,(int *)&local_c8,(int *)&keys);
    __r = (__shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2> *)
          (local_168 + 8);
switchD_003b4daf_default:
    if (to_parse.
        super__Vector_base<std::tuple<miniscript::internal::DecodeContext,_long,_long>,_std::allocator<std::tuple<miniscript::internal::DecodeContext,_long,_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        to_parse.
        super__Vector_base<std::tuple<miniscript::internal::DecodeContext,_long,_long>,_std::allocator<std::tuple<miniscript::internal::DecodeContext,_long,_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if ((long)constructed.
                super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)constructed.
                super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x10) {
        this_00 = ((constructed.
                    super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
        key.super__Optional_base<CPubKey,_true,_true>._M_payload.
        super__Optional_payload_base<CPubKey>._M_payload._8_8_ =
             ((constructed.
               super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
        ((constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ((constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)0x0;
        key.super__Optional_base<CPubKey,_true,_true>._M_payload.
        super__Optional_payload_base<CPubKey>._M_payload._0_8_ = this_00;
        Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>(this_00,ctx);
        bVar12 = Node<CPubKey>::IsValidTopLevel(this_00);
        if (bVar12) {
          ret.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)
                 key.super__Optional_base<CPubKey,_true,_true>._M_payload.
                 super__Optional_payload_base<CPubKey>._M_payload._0_8_;
          ret.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               key.super__Optional_base<CPubKey,_true,_true>._M_payload.
               super__Optional_payload_base<CPubKey>._M_payload._8_8_;
          key.super__Optional_base<CPubKey,_true,_true>._M_payload.
          super__Optional_payload_base<CPubKey>._M_payload._0_8_ = 0;
          key.super__Optional_base<CPubKey,_true,_true>._M_payload.
          super__Optional_payload_base<CPubKey>._M_payload._8_8_ = 0;
        }
        else {
          ret.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)0x0;
          ret.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        peVar22 = ret.
                  super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&key.super__Optional_base<CPubKey,_true,_true>._M_payload.
                           super__Optional_payload_base<CPubKey>._M_payload + 8));
      }
      else {
LAB_003b6822:
        ret.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        ret.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        peVar22 = (element_type *)0x0;
      }
      goto LAB_003b6866;
    }
    if ((constructed.
         super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         constructed.
         super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       (bVar12 = Node<CPubKey>::IsValid
                           (constructed.
                            super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1].
                            super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr), !bVar12)) goto LAB_003b6822;
    pCVar11 = keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    ptVar1 = to_parse.
             super__Vector_base<std::tuple<miniscript::internal::DecodeContext,_long,_long>,_std::allocator<std::tuple<miniscript::internal::DecodeContext,_long,_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    local_b8 = *(ulong *)&to_parse.
                          super__Vector_base<std::tuple<miniscript::internal::DecodeContext,_long,_long>,_std::allocator<std::tuple<miniscript::internal::DecodeContext,_long,_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].
                          super__Tuple_impl<0UL,_miniscript::internal::DecodeContext,_long,_long>.
                          super__Head_base<0UL,_miniscript::internal::DecodeContext,_false>;
    local_c8._M_head_impl =
         to_parse.
         super__Vector_base<std::tuple<miniscript::internal::DecodeContext,_long,_long>,_std::allocator<std::tuple<miniscript::internal::DecodeContext,_long,_long>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1].
         super__Tuple_impl<0UL,_miniscript::internal::DecodeContext,_long,_long>.
         super__Tuple_impl<1UL,_long,_long>.super__Tuple_impl<2UL,_long>.
         super__Head_base<2UL,_long,_false>._M_head_impl;
    uStack_c0 = to_parse.
                super__Vector_base<std::tuple<miniscript::internal::DecodeContext,_long,_long>,_std::allocator<std::tuple<miniscript::internal::DecodeContext,_long,_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].
                super__Tuple_impl<0UL,_miniscript::internal::DecodeContext,_long,_long>.
                super__Tuple_impl<1UL,_long,_long>.super__Head_base<1UL,_long,_false>._M_head_impl;
    to_parse.
    super__Vector_base<std::tuple<miniscript::internal::DecodeContext,_long,_long>,_std::allocator<std::tuple<miniscript::internal::DecodeContext,_long,_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ptVar1;
    switch(local_b8 & 0xffffffff) {
    case 0:
      if ((ulong)uVar10 <= local_1a0) break;
      oVar15 = local_1a0->first;
      if (oVar15 == OP_0) {
        keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     ctx->m_script_ctx);
        local_d8._M_value = (ulong)(uint)local_d8._M_value._4_4_ << 0x20;
        std::
        make_shared<miniscript::Node<CPubKey>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment>
                  ((NoDupCheck *)&key,(MiniscriptContext *)&k_1,(Fragment *)&keys);
        std::
        vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
        ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                  ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                    *)&constructed,(shared_ptr<const_miniscript::Node<CPubKey>_> *)&key);
LAB_003b5910:
        local_1a0 = local_1a0 + 1;
LAB_003b5916:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&key.super__Optional_base<CPubKey,_true,_true>._M_payload.
                           super__Optional_payload_base<CPubKey>._M_payload + 8));
        goto switchD_003b4daf_default;
      }
      if (oVar15 == OP_1) {
        keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     ctx->m_script_ctx);
        local_d8._M_value._0_4_ = 1;
        std::
        make_shared<miniscript::Node<CPubKey>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment>
                  ((NoDupCheck *)&key,(MiniscriptContext *)&k_1,(Fragment *)&keys);
        std::
        vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
        ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                  ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                    *)&constructed,(shared_ptr<const_miniscript::Node<CPubKey>_> *)&key);
        goto LAB_003b5910;
      }
      _Var3._M_current =
           (local_1a0->second).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
      _Var4._M_current =
           (local_1a0->second).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (((long)_Var4._M_current - (long)_Var3._M_current & 0xfffffffffffffffeU) == 0x20) {
        (anonymous_namespace)::KeyConverter::
        FromPKBytes<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (&key,ctx,_Var3,_Var4);
        if (key.super__Optional_base<CPubKey,_true,_true>._M_payload.
            super__Optional_payload_base<CPubKey>._M_engaged == false) break;
        k_1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
        _M_payload._M_value._0_4_ = ctx->m_script_ctx;
        local_168._8_4_ = 2;
        Vector<CPubKey>(&keys,(CPubKey *)&key);
        std::
        make_shared<miniscript::Node<CPubKey>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<CPubKey,std::allocator<CPubKey>>>
                  ((NoDupCheck *)&local_d8,(MiniscriptContext *)local_14c,(Fragment *)&k_1,
                   (vector<CPubKey,_std::allocator<CPubKey>_> *)__r);
        std::
        vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
        ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                  ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                    *)&constructed,(shared_ptr<const_miniscript::Node<CPubKey>_> *)&local_d8);
        local_1a0 = local_1a0 + 1;
LAB_003b59bb:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_d0);
        std::_Vector_base<CPubKey,_std::allocator<CPubKey>_>::~_Vector_base
                  ((_Vector_base<CPubKey,_std::allocator<CPubKey>_> *)&keys);
        goto switchD_003b4daf_default;
      }
      lVar18 = uVar10 - (long)local_1a0;
      lVar20 = lVar18 >> 5;
      if (lVar20 < 5) {
        _auStack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((ulong)stack0xffffffffffffff31 << 8);
        if ((lVar20 < 2) || (oVar15 != OP_CHECKSEQUENCEVERIFY)) {
          if (0x20 < lVar18) goto LAB_003b5cda;
          goto LAB_003b5d8a;
        }
LAB_003b5c33:
        oVar23 = internal::ParseScriptNumber(local_1a0 + 1);
        local_d8._M_value =
             oVar23.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload;
        uStack_cb = (undefined3)
                    ((ulong)key.super__Optional_base<CPubKey,_true,_true>._M_payload.
                            super__Optional_payload_base<CPubKey>._M_payload._0_8_ >> 0x20);
        auStack_d0._1_4_ =
             key.super__Optional_base<CPubKey,_true,_true>._M_payload.
             super__Optional_payload_base<CPubKey>._M_payload._0_4_;
        auStack_d0[0] =
             oVar23.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_engaged;
        if (((undefined1  [16])
             oVar23.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_003b5cda;
        local_1a0 = local_1a0 + 2;
        if (local_d8._M_value - 0x80000000U < 0xffffffff80000001) break;
        keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     ctx->m_script_ctx);
        k_1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
        _M_payload._M_value._0_4_ = 4;
        std::
        make_shared<miniscript::Node<CPubKey>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,long&>
                  ((NoDupCheck *)&key,(MiniscriptContext *)__r,(Fragment *)&keys,(long *)&k_1);
        std::
        vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
        ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                  ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                    *)&constructed,(shared_ptr<const_miniscript::Node<CPubKey>_> *)&key);
        goto LAB_003b5916;
      }
      if (oVar15 == OP_VERIFY) {
        if (((local_1a0[1].first == OP_EQUAL) && (local_1a0[3].first == OP_HASH160)) &&
           (local_1a0[4].first == OP_DUP)) {
          puVar5 = local_1a0[2].second.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar6 = local_1a0[2].second.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if ((long)puVar6 - (long)puVar5 == 0x14) {
            keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)((ulong)keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
            if (puVar6 != puVar5) {
              keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)CONCAT44(SUB84(pCVar11,4),*(undefined4 *)(puVar5 + 0x10));
              keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
              super__Vector_impl_data._M_start = *(pointer *)puVar5;
              keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
              super__Vector_impl_data._M_finish = *(pointer *)(puVar5 + 8);
            }
            __src = std::
                    map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                    ::at((map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                          *)((anonymous_namespace)::g_testdata + 0x48),(key_type *)&keys);
            memcpy((NoDupCheck *)&key,__src,0x41);
            key.super__Optional_base<CPubKey,_true,_true>._M_payload.
            super__Optional_payload_base<CPubKey>._M_engaged = true;
            k_1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
            ._M_payload._M_value._0_4_ = ctx->m_script_ctx;
            local_168._8_4_ = 3;
            Vector<CPubKey>(&keys,(CPubKey *)&key);
            std::
            make_shared<miniscript::Node<CPubKey>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<CPubKey,std::allocator<CPubKey>>>
                      ((NoDupCheck *)&local_d8,(MiniscriptContext *)local_14c,(Fragment *)&k_1,
                       (vector<CPubKey,_std::allocator<CPubKey>_> *)__r);
            std::
            vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
            ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                      ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                        *)&constructed,(shared_ptr<const_miniscript::Node<CPubKey>_> *)&local_d8);
            local_1a0 = local_1a0 + 5;
            goto LAB_003b59bb;
          }
        }
        _auStack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((ulong)stack0xffffffffffffff31 << 8);
      }
      else {
        _auStack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((ulong)stack0xffffffffffffff31 << 8);
        if (oVar15 == OP_CHECKSEQUENCEVERIFY) goto LAB_003b5c33;
      }
LAB_003b5cda:
      if (local_1a0->first == OP_CHECKLOCKTIMEVERIFY) {
        oVar23 = internal::ParseScriptNumber(local_1a0 + 1);
        local_d8._M_value =
             oVar23.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload;
        uStack_cb = (undefined3)
                    ((ulong)key.super__Optional_base<CPubKey,_true,_true>._M_payload.
                            super__Optional_payload_base<CPubKey>._M_payload._0_8_ >> 0x20);
        auStack_d0._1_4_ =
             key.super__Optional_base<CPubKey,_true,_true>._M_payload.
             super__Optional_payload_base<CPubKey>._M_payload._0_4_;
        auStack_d0[0] =
             oVar23.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_engaged;
        if (((undefined1  [16])
             oVar23.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_1a0 = local_1a0 + 2;
          if (local_d8._M_value - 0x80000000U < 0xffffffff80000001) break;
          keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                                        ctx->m_script_ctx);
          k_1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
          _M_payload._M_value._0_4_ = 5;
          std::
          make_shared<miniscript::Node<CPubKey>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,long&>
                    ((NoDupCheck *)&key,(MiniscriptContext *)__r,(Fragment *)&keys,(long *)&k_1);
          std::
          vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
          ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                    ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                      *)&constructed,(shared_ptr<const_miniscript::Node<CPubKey>_> *)&key);
          goto LAB_003b5916;
        }
      }
LAB_003b5d8a:
      if (lVar18 < 0xc1) {
        oVar15 = local_1a0->first;
        if (0x40 < lVar18) goto LAB_003b600d;
        bVar12 = false;
LAB_003b6100:
        if (oVar15 == OP_VERIFY) {
          keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                        _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
          key.super__Optional_base<CPubKey,_true,_true>._M_payload.
          super__Optional_payload_base<CPubKey>._M_payload._0_4_ = 7;
          k_1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
          _M_payload._M_value._0_4_ = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&k_1);
          key.super__Optional_base<CPubKey,_true,_true>._M_payload.
          super__Optional_payload_base<CPubKey>._M_payload._0_8_ =
               key.super__Optional_base<CPubKey,_true,_true>._M_payload.
               super__Optional_payload_base<CPubKey>._M_payload._0_8_ & 0xffffffff00000000;
          keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                        _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
          k_1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
          _M_payload._M_value._0_4_ = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&k_1);
        }
        else if (oVar15 == OP_0NOTEQUAL) {
          keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                        _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
          key.super__Optional_base<CPubKey,_true,_true>._M_payload.
          super__Optional_payload_base<CPubKey>._M_payload._0_4_ = 9;
          k_1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
          _M_payload._M_value._0_4_ = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&k_1);
          key.super__Optional_base<CPubKey,_true,_true>._M_payload.
          super__Optional_payload_base<CPubKey>._M_payload._0_8_ =
               key.super__Optional_base<CPubKey,_true,_true>._M_payload.
               super__Optional_payload_base<CPubKey>._M_payload._0_8_ & 0xffffffff00000000;
          keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                        _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
          k_1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
          _M_payload._M_value._0_4_ = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&k_1);
        }
        else {
          if (oVar15 != OP_CHECKSIG) {
            if (bVar12 && oVar15 == OP_EQUAL) {
              oVar23 = internal::ParseScriptNumber(local_1a0 + 1);
              local_d8._M_value =
                   oVar23.super__Optional_base<long,_true,_true>._M_payload.
                   super__Optional_payload_base<long>._M_payload;
              uStack_cb = (undefined3)
                          ((ulong)key.super__Optional_base<CPubKey,_true,_true>._M_payload.
                                  super__Optional_payload_base<CPubKey>._M_payload._0_8_ >> 0x20);
              auStack_d0._1_4_ =
                   key.super__Optional_base<CPubKey,_true,_true>._M_payload.
                   super__Optional_payload_base<CPubKey>._M_payload._0_4_;
              auStack_d0[0] =
                   oVar23.super__Optional_base<long,_true,_true>._M_payload.
                   super__Optional_payload_base<long>._M_engaged;
              if (((undefined1  [16])
                   oVar23.super__Optional_base<long,_true,_true>._M_payload.
                   super__Optional_payload_base<long> & (undefined1  [16])0x1) !=
                  (undefined1  [16])0x0) {
                if (0 < local_d8._M_value) {
                  key.super__Optional_base<CPubKey,_true,_true>._M_payload.
                  super__Optional_payload_base<CPubKey>._M_payload._0_4_ = 0x11;
                  keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       (pointer)((ulong)keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                        _M_impl.super__Vector_impl_data._M_start &
                                0xffffffff00000000);
                  std::
                  vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                  ::emplace_back<miniscript::internal::DecodeContext,int,long&>
                            ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                              *)&to_parse,(DecodeContext *)&key,(int *)&keys,&local_d8._M_value);
                  goto LAB_003b5a6f;
                }
                break;
              }
              oVar15 = local_1a0->first;
            }
            if (oVar15 == OP_BOOLOR) {
              keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
              key.super__Optional_base<CPubKey,_true,_true>._M_payload.
              super__Optional_payload_base<CPubKey>._M_payload._0_4_ = 0xe;
              k_1.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_payload._M_value._0_4_ = 0xffffffff;
              std::
              vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
              ::emplace_back<miniscript::internal::DecodeContext,int,int>
                        ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                          *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&k_1);
              key.super__Optional_base<CPubKey,_true,_true>._M_payload.
              super__Optional_payload_base<CPubKey>._M_payload._0_8_ =
                   key.super__Optional_base<CPubKey,_true,_true>._M_payload.
                   super__Optional_payload_base<CPubKey>._M_payload._0_8_ & 0xffffffff00000000;
              keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
              k_1.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_payload._M_value._0_4_ = 0xffffffff;
              std::
              vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
              ::emplace_back<miniscript::internal::DecodeContext,int,int>
                        ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                          *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&k_1);
              keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
              key.super__Optional_base<CPubKey,_true,_true>._M_payload.
              super__Optional_payload_base<CPubKey>._M_payload._0_4_ = 2;
              k_1.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_payload._M_value._0_4_ = 0xffffffff;
              std::
              vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
              ::emplace_back<miniscript::internal::DecodeContext,int,int>
                        ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                          *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&k_1);
            }
            else {
              if (oVar15 != OP_BOOLAND) {
                if (oVar15 != OP_ENDIF) break;
                keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
                key.super__Optional_base<CPubKey,_true,_true>._M_payload.
                super__Optional_payload_base<CPubKey>._M_payload._0_4_ = 0x13;
                k_1.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_payload._M_value._0_4_ = 0xffffffff;
                std::
                vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                ::emplace_back<miniscript::internal::DecodeContext,int,int>
                          ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                            *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&k_1);
                keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
                key.super__Optional_base<CPubKey,_true,_true>._M_payload.
                super__Optional_payload_base<CPubKey>._M_payload._0_4_ = 1;
                k_1.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_payload._M_value._0_4_ = 0xffffffff;
                std::
                vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                ::emplace_back<miniscript::internal::DecodeContext,int,int>
                          ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                            *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&k_1);
                local_1a0 = local_1a0 + 1;
                goto switchD_003b4daf_default;
              }
              keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
              key.super__Optional_base<CPubKey,_true,_true>._M_payload.
              super__Optional_payload_base<CPubKey>._M_payload._0_4_ = 0xc;
              k_1.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_payload._M_value._0_4_ = 0xffffffff;
              std::
              vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
              ::emplace_back<miniscript::internal::DecodeContext,int,int>
                        ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                          *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&k_1);
              key.super__Optional_base<CPubKey,_true,_true>._M_payload.
              super__Optional_payload_base<CPubKey>._M_payload._0_8_ =
                   key.super__Optional_base<CPubKey,_true,_true>._M_payload.
                   super__Optional_payload_base<CPubKey>._M_payload._0_8_ & 0xffffffff00000000;
              keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
              k_1.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_payload._M_value._0_4_ = 0xffffffff;
              std::
              vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
              ::emplace_back<miniscript::internal::DecodeContext,int,int>
                        ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                          *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&k_1);
              keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
              key.super__Optional_base<CPubKey,_true,_true>._M_payload.
              super__Optional_payload_base<CPubKey>._M_payload._0_4_ = 2;
              k_1.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_payload._M_value._0_4_ = 0xffffffff;
              std::
              vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
              ::emplace_back<miniscript::internal::DecodeContext,int,int>
                        ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                          *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&k_1);
            }
LAB_003b5a0b:
            local_1a0 = local_1a0 + 1;
            goto switchD_003b4daf_default;
          }
          keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                        _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
          key.super__Optional_base<CPubKey,_true,_true>._M_payload.
          super__Optional_payload_base<CPubKey>._M_payload._0_4_ = 5;
          k_1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
          _M_payload._M_value._0_4_ = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&k_1);
          key.super__Optional_base<CPubKey,_true,_true>._M_payload.
          super__Optional_payload_base<CPubKey>._M_payload._0_8_ =
               key.super__Optional_base<CPubKey,_true,_true>._M_payload.
               super__Optional_payload_base<CPubKey>._M_payload._0_8_ & 0xffffffff00000000;
          keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                        _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
          k_1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
          _M_payload._M_value._0_4_ = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&k_1);
        }
        local_1a0 = local_1a0 + 1;
        goto switchD_003b4daf_default;
      }
      if (((local_1a0->first == OP_EQUAL) && (local_1a0[3].first == OP_VERIFY)) &&
         (local_1a0[4].first == OP_EQUAL)) {
        oVar23 = internal::ParseScriptNumber(local_1a0 + 5);
        local_d8._M_value =
             oVar23.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload;
        uStack_cb = (undefined3)
                    ((ulong)key.super__Optional_base<CPubKey,_true,_true>._M_payload.
                            super__Optional_payload_base<CPubKey>._M_payload._0_8_ >> 0x20);
        auStack_d0._1_4_ =
             key.super__Optional_base<CPubKey,_true,_true>._M_payload.
             super__Optional_payload_base<CPubKey>._M_payload._0_4_;
        auStack_d0[0] =
             oVar23.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_engaged;
        if (((local_d8._M_value == 0x20 &
             oVar23.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_engaged) == 1) && (local_1a0[6].first == OP_SIZE)
           ) {
          switch(local_1a0[2].first) {
          case OP_RIPEMD160:
            if ((long)local_1a0[1].second.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_1a0[1].second.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start == 0x14) {
              keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     ctx->m_script_ctx);
              k_1.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_payload._M_value._0_4_ = 8;
              std::
              make_shared<miniscript::Node<CPubKey>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                        ((NoDupCheck *)&key,(MiniscriptContext *)__r,(Fragment *)&keys,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&k_1);
              std::
              vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
              ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                        ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                          *)&constructed,(shared_ptr<const_miniscript::Node<CPubKey>_> *)&key);
LAB_003b5fe0:
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)&key.super__Optional_base<CPubKey,_true,_true>._M_payload.
                                 super__Optional_payload_base<CPubKey>._M_payload + 8));
              local_1a0 = local_1a0 + 7;
              goto switchD_003b4daf_default;
            }
            break;
          case OP_SHA256:
            if ((long)local_1a0[1].second.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_1a0[1].second.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start == 0x20) {
              keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     ctx->m_script_ctx);
              k_1.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_payload._M_value._0_4_ = 6;
              std::
              make_shared<miniscript::Node<CPubKey>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                        ((NoDupCheck *)&key,(MiniscriptContext *)__r,(Fragment *)&keys,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&k_1);
              std::
              vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
              ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                        ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                          *)&constructed,(shared_ptr<const_miniscript::Node<CPubKey>_> *)&key);
              goto LAB_003b5fe0;
            }
            break;
          case OP_HASH160:
            if ((long)local_1a0[1].second.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_1a0[1].second.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start == 0x14) {
              keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     ctx->m_script_ctx);
              k_1.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_payload._M_value._0_4_ = 9;
              std::
              make_shared<miniscript::Node<CPubKey>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                        ((NoDupCheck *)&key,(MiniscriptContext *)__r,(Fragment *)&keys,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&k_1);
              std::
              vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
              ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                        ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                          *)&constructed,(shared_ptr<const_miniscript::Node<CPubKey>_> *)&key);
              goto LAB_003b5fe0;
            }
            break;
          case OP_HASH256:
            if ((long)local_1a0[1].second.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_1a0[1].second.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start == 0x20) {
              keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     ctx->m_script_ctx);
              k_1.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_payload._M_value._0_4_ = 7;
              std::
              make_shared<miniscript::Node<CPubKey>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                        ((NoDupCheck *)&key,(MiniscriptContext *)__r,(Fragment *)&keys,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&k_1);
              std::
              vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
              ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                        ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                          *)&constructed,(shared_ptr<const_miniscript::Node<CPubKey>_> *)&key);
              goto LAB_003b5fe0;
            }
          }
        }
      }
      oVar15 = local_1a0->first;
LAB_003b600d:
      if (oVar15 == OP_CHECKMULTISIG) {
        bVar12 = IsTapscript(ctx->m_script_ctx);
        if (bVar12) break;
        keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        oVar23 = internal::ParseScriptNumber(local_1a0 + 1);
        _Var16._M_value =
             oVar23.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload;
        if (((((undefined1  [16])
               oVar23.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0)
            || (lVar20 < (long)(_Var16._M_value + 3U))) ||
           (_Var16._M_value - 0x15U < 0xffffffffffffffec)) {
LAB_003b6069:
          ret.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)0x0;
          ret.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          iStack_1b0 = 1;
        }
        else {
          ppuVar21 = &local_1a0[2].second.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          local_190._M_value = _Var16._M_value;
          while (bVar12 = local_190._M_value != 0, local_190._M_value = local_190._M_value - 1,
                bVar12) {
            if (((long)*ppuVar21 - (long)((_Vector_impl_data *)(ppuVar21 + -1))->_M_start != 0x21)
               || ((anonymous_namespace)::KeyConverter::
                   FromPKBytes<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                             (&key,ctx,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                        )((_Vector_impl_data *)(ppuVar21 + -1))->_M_start,
                              (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               )*ppuVar21),
                  key.super__Optional_base<CPubKey,_true,_true>._M_payload.
                  super__Optional_payload_base<CPubKey>._M_engaged == false)) goto LAB_003b6069;
            std::vector<CPubKey,_std::allocator<CPubKey>_>::emplace_back<CPubKey>
                      (&keys,(CPubKey *)&key);
            ppuVar21 = ppuVar21 + 4;
          }
          oVar23 = internal::ParseScriptNumber(local_1a0 + _Var16._M_value + 2);
          key.super__Optional_base<CPubKey,_true,_true>._M_payload.
          super__Optional_payload_base<CPubKey>._M_payload._0_8_ =
               oVar23.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_payload;
          key.super__Optional_base<CPubKey,_true,_true>._M_payload.
          super__Optional_payload_base<CPubKey>._M_payload._M_value.vch[8] =
               oVar23.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_engaged;
          if (((((undefined1  [16])
                 oVar23.super__Optional_base<long,_true,_true>._M_payload.
                 super__Optional_payload_base<long> & (undefined1  [16])0x1) ==
                (undefined1  [16])0x0) ||
              ((long)key.super__Optional_base<CPubKey,_true,_true>._M_payload.
                     super__Optional_payload_base<CPubKey>._M_payload._0_8_ < 1)) ||
             ((ulong)_Var16 <
              (ulong)key.super__Optional_base<CPubKey,_true,_true>._M_payload.
                     super__Optional_payload_base<CPubKey>._M_payload._0_8_)) {
            ret.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            ret.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            iStack_1b0 = 1;
          }
          else {
            std::
            __reverse<__gnu_cxx::__normal_iterator<CPubKey*,std::vector<CPubKey,std::allocator<CPubKey>>>>
                      (keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                       super__Vector_impl_data._M_finish);
            local_168._8_4_ = ctx->m_script_ctx;
            local_14c = (undefined1  [4])0x19;
            std::
            make_shared<miniscript::Node<CPubKey>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<CPubKey,std::allocator<CPubKey>>,long_const&>
                      ((NoDupCheck *)&k_1,(MiniscriptContext *)local_168,(Fragment *)__r,
                       (vector<CPubKey,_std::allocator<CPubKey>_> *)local_14c,(long *)&keys);
            std::
            vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
            ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                      ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                        *)&constructed,(shared_ptr<const_miniscript::Node<CPubKey>_> *)&k_1);
            local_1a0 = local_1a0 + _Var16._M_value + 3U;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &k_1.super__Optional_base<long,_true,_true>._M_payload.
                        super__Optional_payload_base<long>._M_engaged);
            iStack_1b0 = 4;
          }
        }
LAB_003b6075:
        std::_Vector_base<CPubKey,_std::allocator<CPubKey>_>::~_Vector_base
                  (&keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>);
      }
      else {
        bVar12 = true;
        if ((lVar18 == 0x60) || (oVar15 != OP_NUMEQUAL)) goto LAB_003b6100;
        bVar12 = IsTapscript(ctx->m_script_ctx);
        if (!bVar12) break;
        oVar23 = internal::ParseScriptNumber(local_1a0 + 1);
        k_1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
        _M_payload._M_value =
             oVar23.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload;
        k_1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
        _M_engaged = oVar23.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long>._M_engaged;
        if (((((undefined1  [16])
               oVar23.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long> & (undefined1  [16])0x1) != (undefined1  [16])0x0)
            && (0xfffffffffffffc18 <
                k_1.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_payload._M_value - 1000U)) &&
           (k_1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
            ._M_payload._M_value * 2 + 2 <= lVar20)) {
          keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)0x0;
          keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
          ._M_finish = (pointer)0x0;
          keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage = (pointer)0x0;
          std::vector<CPubKey,_std::allocator<CPubKey>_>::reserve
                    (&keys,k_1.super__Optional_base<long,_true,_true>._M_payload.
                           super__Optional_payload_base<long>._M_payload._M_value);
          lVar18 = 2;
          ppVar8 = local_1a0;
          do {
            ppVar19 = ppVar8 + 2;
            lVar18 = lVar18 + 2;
            if ((lVar20 < lVar18) ||
               ((ppVar19->first != OP_CHECKSIG && (ppVar19->first != OP_CHECKSIGADD))))
            goto LAB_003b6069;
            _Var3._M_current =
                 ppVar8[3].second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            _Var4._M_current =
                 ppVar8[3].second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (((long)_Var4._M_current - (long)_Var3._M_current != 0x20) ||
               ((anonymous_namespace)::KeyConverter::
                FromPKBytes<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          (&key,ctx,_Var3,_Var4),
               key.super__Optional_base<CPubKey,_true,_true>._M_payload.
               super__Optional_payload_base<CPubKey>._M_engaged == false)) goto LAB_003b6069;
            std::vector<CPubKey,_std::allocator<CPubKey>_>::emplace_back<CPubKey>
                      (&keys,(CPubKey *)&key);
            _Var16._M_value =
                 ((long)keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                       super__Vector_impl_data._M_start) / 0x41;
            if (999 < (ulong)_Var16) goto LAB_003b6069;
            ppVar8 = ppVar19;
          } while (ppVar19->first != OP_CHECKSIG);
          if ((ulong)_Var16 <
              (ulong)k_1.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long>._M_payload) {
            ret.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            ret.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            iStack_1b0 = 1;
          }
          else {
            std::
            __reverse<__gnu_cxx::__normal_iterator<CPubKey*,std::vector<CPubKey,std::allocator<CPubKey>>>>
                      (keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                       super__Vector_impl_data._M_finish,
                       ((long)keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                             super__Vector_impl_data._M_start) % 0x41);
            local_168._8_4_ = ctx->m_script_ctx;
            local_14c = (undefined1  [4])0x1a;
            std::
            make_shared<miniscript::Node<CPubKey>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<CPubKey,std::allocator<CPubKey>>,long_const&>
                      ((NoDupCheck *)&key,(MiniscriptContext *)local_168,(Fragment *)__r,
                       (vector<CPubKey,_std::allocator<CPubKey>_> *)local_14c,(long *)&keys);
            std::
            vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
            ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                      ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                        *)&constructed,(shared_ptr<const_miniscript::Node<CPubKey>_> *)&key);
            local_1a0 = local_1a0 + _Var16._M_value * 2 + 2;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       ((long)&key.super__Optional_base<CPubKey,_true,_true>._M_payload.
                               super__Optional_payload_base<CPubKey>._M_payload + 8));
            iStack_1b0 = 4;
          }
          goto LAB_003b6075;
        }
        ret.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        ret.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        iStack_1b0 = 1;
      }
      peVar22 = ret.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      if (iStack_1b0 != 4) goto LAB_003b6866;
      goto switchD_003b4daf_default;
    case 1:
      keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
      key.super__Optional_base<CPubKey,_true,_true>._M_payload.super__Optional_payload_base<CPubKey>
      ._M_payload._0_4_ = 10;
      local_d8._M_value._0_4_ = 0xffffffff;
      std::
      vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
      ::emplace_back<miniscript::internal::DecodeContext,int,int>
                ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                  *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&local_d8._M_value);
      key.super__Optional_base<CPubKey,_true,_true>._M_payload.super__Optional_payload_base<CPubKey>
      ._M_payload._0_8_ =
           key.super__Optional_base<CPubKey,_true,_true>._M_payload.
           super__Optional_payload_base<CPubKey>._M_payload._0_8_ & 0xffffffff00000000;
      keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
      local_d8._M_value._0_4_ = 0xffffffff;
      std::
      vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
      ::emplace_back<miniscript::internal::DecodeContext,int,int>
                ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                  *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&local_d8._M_value);
      goto switchD_003b4daf_default;
    case 2:
      if (local_1a0 < (ulong)uVar10) {
        if (local_1a0->first == OP_FROMALTSTACK) {
          keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                        _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
          key.super__Optional_base<CPubKey,_true,_true>._M_payload.
          super__Optional_payload_base<CPubKey>._M_payload._0_4_ = 4;
          local_d8._M_value._0_4_ = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&local_d8._M_value);
          local_1a0 = local_1a0 + 1;
        }
        else {
          keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                        _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
          key.super__Optional_base<CPubKey,_true,_true>._M_payload.
          super__Optional_payload_base<CPubKey>._M_payload._0_4_ = 3;
          local_d8._M_value._0_4_ = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&local_d8._M_value);
        }
        keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
        key.super__Optional_base<CPubKey,_true,_true>._M_payload.
        super__Optional_payload_base<CPubKey>._M_payload._0_4_ = 1;
        local_d8._M_value._0_4_ = 0xffffffff;
        std::
        vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
        ::emplace_back<miniscript::internal::DecodeContext,int,int>
                  ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                    *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&local_d8._M_value);
        goto switchD_003b4daf_default;
      }
      break;
    case 3:
      if (((local_1a0 < (ulong)uVar10) && (local_1a0->first == OP_SWAP)) &&
         (constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        local_d8._M_value._0_4_ = ctx->m_script_ctx;
        k_1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
        _M_payload._M_value._0_4_ = 0xb;
        Vector<std::shared_ptr<miniscript::Node<CPubKey>const>>
                  ((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                    *)&key,constructed.
                           super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1);
        std::
        make_shared<miniscript::Node<CPubKey>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>>
                  ((NoDupCheck *)&keys,(MiniscriptContext *)__r,(Fragment *)&local_d8._M_value,
                   (vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                    *)&k_1);
LAB_003b5042:
        local_1a0 = local_1a0 + 1;
LAB_003b55c4:
        std::__shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&constructed.
                    super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].
                    super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2> *)
                   &keys);
LAB_003b55d5:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                    super__Vector_impl_data._M_finish);
        std::
        vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
        ::~vector((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                   *)&key);
        goto switchD_003b4daf_default;
      }
      break;
    case 4:
      if (((local_1a0 < (ulong)uVar10) && (local_1a0->first == OP_TOALTSTACK)) &&
         (constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        local_d8._M_value._0_4_ = ctx->m_script_ctx;
        k_1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
        _M_payload._M_value._0_4_ = 10;
        Vector<std::shared_ptr<miniscript::Node<CPubKey>const>>
                  ((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                    *)&key,constructed.
                           super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1);
        std::
        make_shared<miniscript::Node<CPubKey>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>>
                  ((NoDupCheck *)&keys,(MiniscriptContext *)__r,(Fragment *)&local_d8._M_value,
                   (vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                    *)&k_1);
        goto LAB_003b5042;
      }
      break;
    case 5:
      if (constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_d8._M_value._0_4_ = ctx->m_script_ctx;
        k_1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
        _M_payload._M_value._0_4_ = 0xc;
        Vector<std::shared_ptr<miniscript::Node<CPubKey>const>>
                  ((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                    *)&key,constructed.
                           super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1);
        std::
        make_shared<miniscript::Node<CPubKey>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>>
                  ((NoDupCheck *)&keys,(MiniscriptContext *)__r,(Fragment *)&local_d8._M_value,
                   (vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                    *)&k_1);
        goto LAB_003b55c4;
      }
      break;
    case 6:
      if (constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_d8._M_value._0_4_ = ctx->m_script_ctx;
        k_1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
        _M_payload._M_value._0_4_ = 0xd;
        Vector<std::shared_ptr<miniscript::Node<CPubKey>const>>
                  ((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                    *)&key,constructed.
                           super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1);
        std::
        make_shared<miniscript::Node<CPubKey>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>>
                  ((NoDupCheck *)&keys,(MiniscriptContext *)__r,(Fragment *)&local_d8._M_value,
                   (vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                    *)&k_1);
        goto LAB_003b55c4;
      }
      break;
    case 7:
      if (constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_d8._M_value._0_4_ = ctx->m_script_ctx;
        k_1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
        _M_payload._M_value._0_4_ = 0xe;
        Vector<std::shared_ptr<miniscript::Node<CPubKey>const>>
                  ((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                    *)&key,constructed.
                           super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1);
        std::
        make_shared<miniscript::Node<CPubKey>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>>
                  ((NoDupCheck *)&keys,(MiniscriptContext *)__r,(Fragment *)&local_d8._M_value,
                   (vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                    *)&k_1);
        goto LAB_003b55c4;
      }
      break;
    case 8:
      if (constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_d8._M_value._0_4_ = ctx->m_script_ctx;
        k_1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
        _M_payload._M_value._0_4_ = 0xf;
        Vector<std::shared_ptr<miniscript::Node<CPubKey>const>>
                  ((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                    *)&key,constructed.
                           super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1);
        std::
        make_shared<miniscript::Node<CPubKey>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>>
                  ((NoDupCheck *)&keys,(MiniscriptContext *)__r,(Fragment *)&local_d8._M_value,
                   (vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                    *)&k_1);
        goto LAB_003b55c4;
      }
      break;
    case 9:
      if (constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_d8._M_value._0_4_ = ctx->m_script_ctx;
        k_1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
        _M_payload._M_value._0_4_ = 0x10;
        Vector<std::shared_ptr<miniscript::Node<CPubKey>const>>
                  ((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                    *)&key,constructed.
                           super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1);
        std::
        make_shared<miniscript::Node<CPubKey>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>>
                  ((NoDupCheck *)&keys,(MiniscriptContext *)__r,(Fragment *)&local_d8._M_value,
                   (vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                    *)&k_1);
        goto LAB_003b55c4;
      }
      break;
    case 10:
      if ((local_1a0 < (ulong)uVar10) &&
         ((uVar14 = local_1a0->first - OP_IF, 0x19 < uVar14 ||
          ((0x2000113U >> (uVar14 & 0x1f) & 1) == 0)))) {
        keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
        key.super__Optional_base<CPubKey,_true,_true>._M_payload.
        super__Optional_payload_base<CPubKey>._M_payload._0_4_ = 0xb;
        local_d8._M_value._0_4_ = 0xffffffff;
        std::
        vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
        ::emplace_back<miniscript::internal::DecodeContext,int,int>
                  ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                    *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&local_d8._M_value);
        keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
        key.super__Optional_base<CPubKey,_true,_true>._M_payload.
        super__Optional_payload_base<CPubKey>._M_payload._0_4_ = 1;
        local_d8._M_value._0_4_ = 0xffffffff;
        std::
        vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
        ::emplace_back<miniscript::internal::DecodeContext,int,int>
                  ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                    *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&local_d8._M_value);
      }
      goto switchD_003b4daf_default;
    case 0xb:
      if (0x10 < (ulong)((long)constructed.
                               super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)constructed.
                              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        nt = AND_V;
LAB_003b4fbd:
        internal::BuildBack<CPubKey>(ctx->m_script_ctx,nt,&constructed,true);
        goto switchD_003b4daf_default;
      }
      break;
    case 0xc:
      if (0x10 < (ulong)((long)constructed.
                               super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)constructed.
                              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        nt = AND_B;
        goto LAB_003b4fbd;
      }
      break;
    case 0xd:
      if (0x20 < (ulong)((long)constructed.
                               super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)constructed.
                              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        psVar9 = constructed.
                 super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
        keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)constructed.
                            super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1].
                            super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr;
        keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)constructed.
                             super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish[-1].
                             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
        constructed.
        super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].
        super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        constructed.
        super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].
        super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        constructed.
        super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             constructed.
             super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&(psVar9->
                    super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_refcount);
        psVar9 = constructed.
                 super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
        local_d8 = *(_Storage<long,_true> *)
                    (constructed.
                     super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1);
        _auStack_d0 = constructed.
                      super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].
                      super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        constructed.
        super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].
        super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        constructed.
        super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].
        super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        constructed.
        super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             constructed.
             super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&(psVar9->
                    super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>)
                    ._M_refcount);
        k_1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
        _M_payload = *(_Storage<long,_true> *)
                      (constructed.
                       super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1);
        k_1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
        _8_8_ = constructed.
                super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].
                super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
        constructed.
        super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].
        super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        constructed.
        super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].
        super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_14c = (undefined1  [4])ctx->m_script_ctx;
        local_168._0_4_ = 0x17;
        Vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::shared_ptr<miniscript::Node<CPubKey>const>,std::shared_ptr<miniscript::Node<CPubKey>const>>
                  ((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                    *)&key,(shared_ptr<const_miniscript::Node<CPubKey>_> *)&keys,
                   (shared_ptr<const_miniscript::Node<CPubKey>_> *)&k_1,
                   (shared_ptr<const_miniscript::Node<CPubKey>_> *)&local_d8);
        std::
        make_shared<miniscript::Node<CPubKey>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>>
                  ((NoDupCheck *)__r,(MiniscriptContext *)(local_168 + 7),(Fragment *)local_14c,
                   (vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                    *)local_168);
        std::__shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&constructed.
                    super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].
                    super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>,
                   __r);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_158);
        std::
        vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
        ::~vector((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                   *)&key);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &k_1.super__Optional_base<long,_true,_true>._M_payload.
                    super__Optional_payload_base<long>._M_engaged);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_d0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                    super__Vector_impl_data._M_finish);
        goto switchD_003b4daf_default;
      }
      break;
    case 0xe:
      if (0x10 < (ulong)((long)constructed.
                               super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)constructed.
                              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        nt = OR_B;
        goto LAB_003b4fbd;
      }
      break;
    case 0xf:
      if (0x10 < (ulong)((long)constructed.
                               super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)constructed.
                              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        nt = OR_C;
        goto LAB_003b4fbd;
      }
      break;
    case 0x10:
      if (0x10 < (ulong)((long)constructed.
                               super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)constructed.
                              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        nt = OR_D;
        goto LAB_003b4fbd;
      }
      break;
    case 0x11:
      if (local_1a0 < (ulong)uVar10) {
        if (local_1a0->first == OP_ADD) {
          keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                        _M_impl.super__Vector_impl_data._M_start._4_4_,0x11);
          key.super__Optional_base<CPubKey,_true,_true>._M_payload.
          super__Optional_payload_base<CPubKey>._M_payload._0_8_ = uStack_c0 + 1;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,long,long&>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&to_parse,(DecodeContext *)&keys,(long *)&key,&local_c8._M_head_impl);
          keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                        _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
          key.super__Optional_base<CPubKey,_true,_true>._M_payload.
          super__Optional_payload_base<CPubKey>._M_payload._0_4_ = 2;
          local_d8._M_value._0_4_ = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&local_d8._M_value);
          goto LAB_003b5a0b;
        }
        keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,0x12);
        key.super__Optional_base<CPubKey,_true,_true>._M_payload.
        super__Optional_payload_base<CPubKey>._M_payload._0_8_ = uStack_c0 + 1;
        std::
        vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
        ::emplace_back<miniscript::internal::DecodeContext,long,long&>
                  ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                    *)&to_parse,(DecodeContext *)&keys,(long *)&key,&local_c8._M_head_impl);
        key.super__Optional_base<CPubKey,_true,_true>._M_payload.
        super__Optional_payload_base<CPubKey>._M_payload._0_8_ =
             key.super__Optional_base<CPubKey,_true,_true>._M_payload.
             super__Optional_payload_base<CPubKey>._M_payload._0_8_ & 0xffffffff00000000;
        keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
        local_d8._M_value._0_4_ = 0xffffffff;
        std::
        vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
        ::emplace_back<miniscript::internal::DecodeContext,int,int>
                  ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                    *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&local_d8._M_value);
        goto switchD_003b4daf_default;
      }
      break;
    case 0x12:
      if (((0 < local_c8._M_head_impl) && (local_c8._M_head_impl <= (long)uStack_c0)) &&
         (uStack_c0 <=
          (ulong)((long)constructed.
                        super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)constructed.
                        super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4))) {
        key.super__Optional_base<CPubKey,_true,_true>._M_payload.
        super__Optional_payload_base<CPubKey>._M_payload._0_8_ = 0;
        key.super__Optional_base<CPubKey,_true,_true>._M_payload.
        super__Optional_payload_base<CPubKey>._M_payload._8_8_ = 0;
        key.super__Optional_base<CPubKey,_true,_true>._M_payload.
        super__Optional_payload_base<CPubKey>._M_payload._16_8_ = 0;
        for (lVar18 = 0; lVar18 < (long)uStack_c0; lVar18 = lVar18 + 1) {
          psVar9 = constructed.
                   super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1;
          keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)constructed.
                               super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish[-1].
                               super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr;
          keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
          ._M_finish = (pointer)constructed.
                                super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish[-1].
                                super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi;
          constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].
          super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].
          super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          constructed.
          super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               constructed.
               super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&(psVar9->
                      super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_refcount);
          std::
          vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
          ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                    ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                      *)&key,(shared_ptr<const_miniscript::Node<CPubKey>_> *)&keys);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                      super__Vector_impl_data._M_finish);
        }
        local_d8._M_value._0_4_ = ctx->m_script_ctx;
        k_1.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
        _M_payload._M_value._0_4_ = 0x18;
        std::
        make_shared<miniscript::Node<CPubKey>const,miniscript::internal::NoDupCheck,miniscript::MiniscriptContext,miniscript::Fragment,std::vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>,long&>
                  ((NoDupCheck *)&keys,(MiniscriptContext *)__r,(Fragment *)&local_d8._M_value,
                   (vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                    *)&k_1,(long *)&key);
        std::
        vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
        ::emplace_back<std::shared_ptr<miniscript::Node<CPubKey>const>>
                  ((vector<std::shared_ptr<miniscript::Node<CPubKey>const>,std::allocator<std::shared_ptr<miniscript::Node<CPubKey>const>>>
                    *)&constructed,(shared_ptr<const_miniscript::Node<CPubKey>_> *)&keys);
        goto LAB_003b55d5;
      }
      break;
    case 0x13:
      if (local_1a0 < (ulong)uVar10) {
        oVar15 = local_1a0->first;
        if (oVar15 == OP_IF) {
          if (0x20 < uVar10 - (long)local_1a0) {
            if (local_1a0[1].first == OP_DUP) {
              keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
              key.super__Optional_base<CPubKey,_true,_true>._M_payload.
              super__Optional_payload_base<CPubKey>._M_payload._0_4_ = 6;
              local_d8._M_value._0_4_ = 0xffffffff;
              std::
              vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
              ::emplace_back<miniscript::internal::DecodeContext,int,int>
                        ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                          *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&local_d8._M_value);
LAB_003b5a6f:
              local_1a0 = local_1a0 + 2;
              goto switchD_003b4daf_default;
            }
            if (((uVar10 - (long)local_1a0 != 0x40) && (local_1a0[1].first == OP_0NOTEQUAL)) &&
               (local_1a0[2].first == OP_SIZE)) {
              keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
              key.super__Optional_base<CPubKey,_true,_true>._M_payload.
              super__Optional_payload_base<CPubKey>._M_payload._0_4_ = 8;
              local_d8._M_value._0_4_ = 0xffffffff;
              std::
              vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
              ::emplace_back<miniscript::internal::DecodeContext,int,int>
                        ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                          *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&local_d8._M_value);
              local_1a0 = local_1a0 + 3;
              goto switchD_003b4daf_default;
            }
          }
        }
        else {
          if (oVar15 == OP_NOTIF) {
            keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
            key.super__Optional_base<CPubKey,_true,_true>._M_payload.
            super__Optional_payload_base<CPubKey>._M_payload._0_4_ = 0x14;
            local_d8._M_value._0_4_ = 0xffffffff;
            std::
            vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
            ::emplace_back<miniscript::internal::DecodeContext,int,int>
                      ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                        *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&local_d8._M_value);
            goto LAB_003b5a0b;
          }
          if (oVar15 == OP_ELSE) {
            keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
            key.super__Optional_base<CPubKey,_true,_true>._M_payload.
            super__Optional_payload_base<CPubKey>._M_payload._0_4_ = 0x15;
            local_d8._M_value._0_4_ = 0xffffffff;
            std::
            vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
            ::emplace_back<miniscript::internal::DecodeContext,int,int>
                      ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                        *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&local_d8._M_value);
            keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
            key.super__Optional_base<CPubKey,_true,_true>._M_payload.
            super__Optional_payload_base<CPubKey>._M_payload._0_4_ = 1;
            local_d8._M_value._0_4_ = 0xffffffff;
            std::
            vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
            ::emplace_back<miniscript::internal::DecodeContext,int,int>
                      ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                        *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&local_d8._M_value);
            local_1a0 = local_1a0 + 1;
            goto switchD_003b4daf_default;
          }
        }
      }
      break;
    case 0x14:
      if (local_1a0 < (ulong)uVar10) {
        if (local_1a0->first == OP_IFDUP) {
          keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                        _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
          key.super__Optional_base<CPubKey,_true,_true>._M_payload.
          super__Optional_payload_base<CPubKey>._M_payload._0_4_ = 0x10;
          local_d8._M_value._0_4_ = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&local_d8._M_value);
          local_1a0 = local_1a0 + 1;
        }
        else {
          keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                        _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
          key.super__Optional_base<CPubKey,_true,_true>._M_payload.
          super__Optional_payload_base<CPubKey>._M_payload._0_4_ = 0xf;
          local_d8._M_value._0_4_ = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&local_d8._M_value);
        }
        key.super__Optional_base<CPubKey,_true,_true>._M_payload.
        super__Optional_payload_base<CPubKey>._M_payload._0_8_ =
             key.super__Optional_base<CPubKey,_true,_true>._M_payload.
             super__Optional_payload_base<CPubKey>._M_payload._0_8_ & 0xffffffff00000000;
        keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
        local_d8._M_value._0_4_ = 0xffffffff;
        std::
        vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
        ::emplace_back<miniscript::internal::DecodeContext,int,int>
                  ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                    *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&local_d8._M_value);
        goto switchD_003b4daf_default;
      }
      break;
    case 0x15:
      if (local_1a0 < (ulong)uVar10) {
        if (local_1a0->first == OP_NOTIF) {
          keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                        _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
          key.super__Optional_base<CPubKey,_true,_true>._M_payload.
          super__Optional_payload_base<CPubKey>._M_payload._0_4_ = 0xd;
          local_d8._M_value._0_4_ = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&local_d8._M_value);
          key.super__Optional_base<CPubKey,_true,_true>._M_payload.
          super__Optional_payload_base<CPubKey>._M_payload._0_8_ =
               key.super__Optional_base<CPubKey,_true,_true>._M_payload.
               super__Optional_payload_base<CPubKey>._M_payload._0_8_ & 0xffffffff00000000;
          keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)CONCAT44(keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                        _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
          local_d8._M_value._0_4_ = 0xffffffff;
          std::
          vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
          ::emplace_back<miniscript::internal::DecodeContext,int,int>
                    ((vector<std::tuple<miniscript::internal::DecodeContext,long,long>,std::allocator<std::tuple<miniscript::internal::DecodeContext,long,long>>>
                      *)&to_parse,(DecodeContext *)&key,(int *)&keys,(int *)&local_d8._M_value);
          local_1a0 = local_1a0 + 1;
          goto switchD_003b4daf_default;
        }
        if (local_1a0->first == OP_IF) {
          local_1a0 = local_1a0 + 1;
          nt = OR_I;
          goto LAB_003b4fbd;
        }
      }
      break;
    default:
      goto switchD_003b4daf_default;
    }
    ret.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ret.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    peVar22 = (element_type *)0x0;
    goto LAB_003b6866;
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  goto LAB_003b68c3;
LAB_003b6866:
  std::
  vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
  ::~vector(&constructed);
  std::
  _Vector_base<std::tuple<miniscript::internal::DecodeContext,_long,_long>,_std::allocator<std::tuple<miniscript::internal::DecodeContext,_long,_long>_>_>
  ::~_Vector_base(&to_parse.
                   super__Vector_base<std::tuple<miniscript::internal::DecodeContext,_long,_long>,_std::allocator<std::tuple<miniscript::internal::DecodeContext,_long,_long>_>_>
                 );
  _Var17 = ret.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount;
  if ((peVar22 == (element_type *)0x0) ||
     (local_1a0 !=
      decomposed.
      super__Optional_base<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
      ._M_payload._M_value.
      super__Vector_base<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    *(element_type **)this = peVar22;
    ret.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var17._M_pi;
    ret.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ret.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
LAB_003b68c3:
  std::
  _Optional_payload_base<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  ::_M_reset((_Optional_payload_base<std::vector<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<opcodetype,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
              *)&decomposed);
  _Var17._M_pi = extraout_RDX_00;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
LAB_003b6d0b:
    __stack_chk_fail();
  }
LAB_003b68e7:
  NVar24.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var17._M_pi;
  NVar24.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (NodeRef<typename_KeyConverter::Key>)
         NVar24.super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline NodeRef<typename Ctx::Key> FromScript(const CScript& script, const Ctx& ctx) {
    using namespace internal;
    // A too large Script is necessarily invalid, don't bother parsing it.
    if (script.size() > MaxScriptSize(ctx.MsContext())) return {};
    auto decomposed = DecomposeScript(script);
    if (!decomposed) return {};
    auto it = decomposed->begin();
    auto ret = DecodeScript<typename Ctx::Key>(it, decomposed->end(), ctx);
    if (!ret) return {};
    if (it != decomposed->end()) return {};
    return ret;
}